

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

int QuaternionEquals(Quaternion p,Quaternion q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float fStack_14;
  
  fVar6 = q.x;
  fVar4 = p.x;
  fVar5 = p.y;
  fVar2 = fmaxf(ABS(fVar4),ABS(fVar6));
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  fStack_14 = q.y;
  fStack_54 = p.w;
  fStack_44 = q.w;
  local_58 = p.z;
  local_48 = q.z;
  if (ABS(fVar4 - fVar6) <= fVar2 * 1e-06) {
    fVar3 = fmaxf(ABS(fVar5),ABS(fStack_14));
    if (fVar3 <= 1.0) {
      fVar3 = 1.0;
    }
    if (ABS(fVar5 - fStack_14) <= fVar3 * 1e-06) {
      fVar3 = fmaxf(ABS(local_58),ABS(local_48));
      if (fVar3 <= 1.0) {
        fVar3 = 1.0;
      }
      if (ABS(local_58 - local_48) <= fVar3 * 1e-06) {
        fVar3 = fmaxf(ABS(fStack_54),ABS(fStack_44));
        if (fVar3 <= 1.0) {
          fVar3 = 1.0;
        }
        if (ABS(fStack_54 - fStack_44) <= fVar3 * 1e-06) {
          return 1;
        }
      }
    }
  }
  uVar1 = 0;
  if (ABS(fVar4 + fVar6) <= fVar2 * 1e-06) {
    fVar4 = fmaxf(ABS(fVar5),ABS(fStack_14));
    if (fVar4 <= 1.0) {
      fVar4 = 1.0;
    }
    if (ABS(fVar5 + fStack_14) <= fVar4 * 1e-06) {
      fVar4 = fmaxf(ABS(local_58),ABS(local_48));
      if (fVar4 <= 1.0) {
        fVar4 = 1.0;
      }
      uVar1 = 0;
      if (ABS(local_58 + local_48) <= fVar4 * 1e-06) {
        fVar4 = fmaxf(ABS(fStack_54),ABS(fStack_44));
        if (fVar4 <= 1.0) {
          fVar4 = 1.0;
        }
        uVar1 = (uint)(ABS(fStack_54 + fStack_44) <= fVar4 * 1e-06);
      }
    }
  }
  return uVar1;
}

Assistant:

RMAPI int QuaternionEquals(Quaternion p, Quaternion q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = (((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z - q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w - q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w)))))) ||
                 (((fabsf(p.x + q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y + q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z + q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w + q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w))))));

    return result;
}